

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-attack.c
# Opt level: O1

_Bool make_attack_normal(monster_conflict *mon,player *p)

{
  loc_conflict grid2;
  monster_race *pmVar1;
  monster_blow *pmVar2;
  blow_method *pbVar3;
  undefined8 *puVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  byte bVar7;
  _Bool _Var8;
  _Bool _Var9;
  bool bVar10;
  int iVar11;
  uint32_t uVar12;
  wchar_t wVar13;
  monster_lore *lore;
  monster_lore *pmVar14;
  melee_effect_handler_f p_Var15;
  wchar_t rlev;
  ulong uVar16;
  bool bVar17;
  wchar_t wVar18;
  long lVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  source sVar23;
  random_value v;
  random_value dice;
  random_value dice_00;
  source origin;
  melee_effect_handler_context_t context;
  char m_name [80];
  char ddesc [80];
  
  lore = get_lore(mon->race);
  wVar18 = mon->race->level;
  rlev = L'\x01';
  if (L'\x01' < wVar18) {
    rlev = wVar18;
  }
  _Var8 = flag_has_dbg(mon->race->flags,0xc,0x1a,"mon->race->flags","RF_NEVER_BLOW");
  if (!_Var8) {
    monster_desc(m_name,0x50,(monster *)mon,L'̔');
    monster_desc(ddesc,0x50,(monster *)mon,L'\x88');
    if (z_info->mon_blows_max != 0) {
      lVar19 = 0;
      uVar16 = 0;
      bVar7 = 0;
      do {
        grid2 = p->grid;
        _Var9 = monster_is_visible((monster *)mon);
        bVar10 = true;
        bVar17 = true;
        if (!_Var9) {
          bVar17 = L'\0' < mon->race->light;
        }
        pmVar1 = mon->race;
        pmVar2 = pmVar1->blow;
        pbVar3 = *(blow_method **)((long)&pmVar2->method + lVar19);
        if (((pbVar3 != (blow_method *)0x0) && (p->is_dead == false)) &&
           (p->upkeep->generate_level == false)) {
          puVar4 = *(undefined8 **)((long)&pmVar2->effect + lVar19);
          if (puVar4 == (undefined8 *)0x0) {
            __assert_fail("effect",
                          "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-attack.c"
                          ,0x29e,"_Bool make_attack_normal(struct monster *, struct player *)");
          }
          uVar5 = *(undefined8 *)((long)&(pmVar2->dice).base + lVar19);
          uVar6 = *(undefined8 *)((long)&(pmVar2->dice).sides + lVar19);
          iVar11 = strcmp((char *)*puVar4,"NONE");
          if (iVar11 == 0) {
LAB_0016ec9f:
            disturb(p);
            pmVar14 = get_lore(mon->race);
            wVar18 = mon->race->level;
            if (wVar18 < L'\x02') {
              wVar18 = L'\x01';
            }
            if ((p->timed[0xb] < 1) || (_Var9 = monster_is_evil((monster *)mon), !_Var9)) {
LAB_0016ed74:
              wVar18 = Rand_div(100);
              if (wVar18 < (p->state).evasion_chance) {
                if (p->timed[3] != 0) {
                  bVar10 = false;
                  goto LAB_0016ee0c;
                }
                msg("You evade the attack!");
              }
              bVar10 = false;
            }
            else {
              _Var9 = monster_is_visible((monster *)mon);
              if (_Var9) {
                flag_on_dbg(pmVar14->flags,0xc,0x48,"lore->flags","RF_EVIL");
              }
              if ((p->lev < wVar18) || (uVar12 = Rand_div(100), (int)((int)p->lev + uVar12) < 0x33))
              goto LAB_0016ed74;
              msg("%s is repelled.",m_name);
              bVar10 = true;
            }
LAB_0016ee0c:
            if (bVar10) {
              cVar20 = '\x01';
              wVar18 = L'\0';
            }
            else {
              cVar22 = pbVar3->cut;
              cVar21 = pbVar3->stun;
              v.sides = (int)uVar6;
              v.m_bonus = (int)((ulong)uVar6 >> 0x20);
              v.base = (int)uVar5;
              v.dice = (int)((ulong)uVar5 >> 0x20);
              wVar18 = randcalc(v,rlev,RANDOMISE);
              if (mon->m_timed[1] != 0) {
                wVar18 = (wVar18 * 0x4b) / 100;
              }
              p_Var15 = melee_handler_for_blow_effect((char *)*puVar4);
              if (p_Var15 == (melee_effect_handler_f)0x0) {
                msg("ERROR: Effect handler not found for %s.",*puVar4);
                cVar20 = '\x01';
              }
              else {
                context.t_mon = (monster_conflict *)0x0;
                context.ac = (p->state).to_a + (p->state).ac;
                context.ddesc = ddesc;
                context.obvious = true;
                context.blinked = (_Bool)(bVar7 & 1);
                context.m_name = m_name;
                context.p = p;
                context.mon = mon;
                context.rlev = rlev;
                context.method = pbVar3;
                context.damage = wVar18;
                (*p_Var15)(&context);
                cVar20 = context.obvious;
                wVar18 = context.damage;
                bVar7 = context.blinked;
              }
              if (p->is_dead != false) {
                cVar21 = '\0';
                cVar22 = '\0';
              }
              if ((cVar22 == '\x01') && (cVar21 != '\0')) {
                uVar12 = Rand_div(100);
                if ((int)uVar12 < 0x32) {
                  cVar22 = '\0';
                }
                else {
                  cVar21 = '\0';
                }
              }
              if (cVar22 != '\0') {
                dice.sides = (int)uVar6;
                dice.m_bonus = (int)((ulong)uVar6 >> 0x20);
                dice.base = (int)uVar5;
                dice.dice = (int)((ulong)uVar5 >> 0x20);
                wVar13 = monster_critical(dice,rlev,wVar18);
                switch(wVar13) {
                case L'\0':
                  break;
                case L'\x01':
                  uVar12 = Rand_div(5);
                  wVar13 = uVar12 + L'\x01';
                  break;
                case L'\x02':
                  uVar12 = Rand_div(5);
                  wVar13 = uVar12 + L'\x06';
                  break;
                case L'\x03':
                  uVar12 = Rand_div(0x14);
                  wVar13 = uVar12 + L'\x15';
                  break;
                case L'\x04':
                  uVar12 = Rand_div(0x32);
                  wVar13 = uVar12 + L'3';
                  break;
                case L'\x05':
                  uVar12 = Rand_div(100);
                  wVar13 = uVar12 + L'e';
                  break;
                case L'\x06':
                  wVar13 = L'Ĭ';
                  break;
                default:
                  wVar13 = L'Ǵ';
                }
                if (wVar13 != L'\0') {
                  player_inc_timed(p,L'\b',wVar13,true,true,true);
                }
              }
              if (cVar21 != '\0') {
                dice_00.sides = (int)uVar6;
                dice_00.m_bonus = (int)((ulong)uVar6 >> 0x20);
                dice_00.base = (int)uVar5;
                dice_00.dice = (int)((ulong)uVar5 >> 0x20);
                wVar13 = monster_critical(dice_00,rlev,wVar18);
                switch(wVar13) {
                case L'\0':
                  break;
                case L'\x01':
                  uVar12 = Rand_div(5);
                  wVar13 = uVar12 + L'\x01';
                  break;
                case L'\x02':
                  uVar12 = Rand_div(10);
                  wVar13 = uVar12 + L'\v';
                  break;
                case L'\x03':
                  uVar12 = Rand_div(0x14);
                  wVar13 = uVar12 + L'\x15';
                  break;
                case L'\x04':
                  uVar12 = Rand_div(0x1e);
                  wVar13 = uVar12 + L'\x1f';
                  break;
                case L'\x05':
                  uVar12 = Rand_div(0x28);
                  wVar13 = uVar12 + L')';
                  break;
                case L'\x06':
                  wVar13 = L'd';
                  break;
                default:
                  wVar13 = L'È';
                }
                if (wVar13 != L'\0') {
                  player_inc_timed(p,L'\t',wVar13,true,true,true);
                }
              }
            }
            if (bVar10) {
              bVar10 = false;
              goto LAB_0016f16a;
            }
          }
          else {
            wVar18 = pmVar1->level;
            iVar11 = wVar18 * 3;
            if (wVar18 < L'\x01') {
              iVar11 = 3;
            }
            wVar18 = iVar11 + *(int *)(puVar4 + 1);
            if (mon->m_timed[1] != 0) {
              wVar18 = (wVar18 * 0x4b) / 100;
            }
            _Var9 = check_hit(p,wVar18);
            if (_Var9) goto LAB_0016ec9f;
            _Var9 = monster_is_visible((monster *)mon);
            if ((_Var9) && (pbVar3->miss == true)) {
              disturb(p);
              msg("%s misses you.",m_name);
            }
            cVar20 = '\0';
            wVar18 = L'\0';
          }
          if ((bVar17) &&
             (((cVar20 != '\0' || (wVar18 != L'\0')) ||
              (10 < *(int *)((long)&lore->blows->times_seen + lVar19))))) {
            iVar11 = *(int *)((long)&lore->blows->times_seen + lVar19);
            if (iVar11 < 0xff) {
              *(int *)((long)&lore->blows->times_seen + lVar19) = iVar11 + 1;
            }
          }
          _Var9 = loc_eq(p->grid,grid2);
          bVar10 = !_Var9;
        }
LAB_0016f16a:
        if (bVar10) break;
        uVar16 = uVar16 + 1;
        lVar19 = lVar19 + 0x30;
      } while (uVar16 < z_info->mon_blows_max);
      if ((bVar7 & 1) != 0) {
        if ((p->is_dead == false) && (_Var9 = square_isseen(cave,mon->grid), _Var9)) {
          add_monster_message(mon,L'7',true);
        }
        strnfmt((char *)&context,5,"%d",(ulong)((uint)z_info->max_sight * 2 + 5));
        sVar23 = source_monster(mon->midx);
        origin.which = sVar23.which;
        origin._4_4_ = 0;
        origin.what = sVar23.what;
        effect_simple(L';',origin,(char *)&context,L'\0',L'\0',L'\0',L'\0',L'\0',(_Bool *)0x0);
      }
    }
    if ((p->is_dead == true) && (lore->deaths < 0x7fff)) {
      lore->deaths = lore->deaths + 1;
    }
    lore_update(mon->race,lore);
  }
  return !_Var8;
}

Assistant:

bool make_attack_normal(struct monster *mon, struct player *p)
{
	struct monster_lore *lore = get_lore(mon->race);
	int rlev = ((mon->race->level >= 1) ? mon->race->level : 1);
	int ap_cnt;
	char m_name[80];
	char ddesc[80];
	bool blinked = false;

	/* Not allowed to attack */
	if (rf_has(mon->race->flags, RF_NEVER_BLOW)) return (false);

	/* Get the monster name (or "it") */
	monster_desc(m_name, sizeof(m_name), mon, MDESC_STANDARD);

	/* Get the "died from" information (i.e. "a kobold") */
	monster_desc(ddesc, sizeof(ddesc), mon, MDESC_SHOW | MDESC_IND_VIS);

	/* Scan through all blows */
	for (ap_cnt = 0; ap_cnt < z_info->mon_blows_max; ap_cnt++) {
		struct loc pgrid = p->grid;
		bool visible = monster_is_visible(mon) || (mon->race->light > 0);
		bool obvious = false;

		int damage = 0;
		bool do_cut = false;
		bool do_stun = false;

		/* Extract the attack infomation */
		struct blow_effect *effect = mon->race->blow[ap_cnt].effect;
		struct blow_method *method = mon->race->blow[ap_cnt].method;
		random_value dice = mon->race->blow[ap_cnt].dice;

		/* No more attacks */
		if (!method) break;

		/* Handle "leaving" */
		if (p->is_dead || p->upkeep->generate_level) break;

		/* Monster hits player */
		assert(effect);
		if (streq(effect->name, "NONE") ||
			check_hit(p, chance_of_monster_hit(mon, effect))) {
			melee_effect_handler_f effect_handler;

			/* Always disturbing and obvious */
			disturb(p);
			obvious = true;

			/* Sometimes we can avoid the blow */
			if (player_avoid_blow(mon, m_name, p)) continue;

			do_cut = method->cut;
			do_stun = method->stun;

			/* Roll dice */
			damage = randcalc(dice, rlev, RANDOMISE);

			/* Reduce damage when stunned */
			if (mon->m_timed[MON_TMD_STUN]) {
				damage = (damage * (100 - STUN_DAM_REDUCTION)) / 100;
			}

			/* Perform the actual effect. */
			effect_handler = melee_handler_for_blow_effect(effect->name);
			if (effect_handler != NULL) {
				melee_effect_handler_context_t context = {
					p,
					mon,
					NULL,
					rlev,
					method,
					p->state.ac + p->state.to_a,
					ddesc,
					obvious,
					blinked,
					damage,
					m_name
				};

				effect_handler(&context);

				/* Save any changes made in the handler for later use. */
				obvious = context.obvious;
				blinked = context.blinked;
				damage = context.damage;
			} else {
				msg("ERROR: Effect handler not found for %s.", effect->name);
			}

			/* Don't cut or stun if player is dead */
			if (p->is_dead) {
				do_cut = false;
				do_stun = false;
			}

			/* Hack -- only one of cut or stun */
			if (do_cut && do_stun) {
				/* Cancel cut */
				if (randint0(100) < 50)
					do_cut = false;

				/* Cancel stun */
				else
					do_stun = false;
			}

			/* Handle cut */
			if (do_cut) {
				/* Critical hit (zero if non-critical) */
				int amt, tmp = monster_critical(dice, rlev, damage);

				/* Roll for damage */
				switch (tmp) {
					case 0: amt = 0; break;
					case 1: amt = randint1(5); break;
					case 2: amt = randint1(5) + 5; break;
					case 3: amt = randint1(20) + 20; break;
					case 4: amt = randint1(50) + 50; break;
					case 5: amt = randint1(100) + 100; break;
					case 6: amt = 300; break;
					default: amt = 500; break;
				}

				/* Apply the cut */
				if (amt) {
					(void)player_inc_timed(p, TMD_CUT, amt,
						true, true, true);
				}
			}

			/* Handle stun */
			if (do_stun) {
				/* Critical hit (zero if non-critical) */
				int amt, tmp = monster_critical(dice, rlev, damage);

				/* Roll for damage */
				switch (tmp) {
					case 0: amt = 0; break;
					case 1: amt = randint1(5); break;
					case 2: amt = randint1(10) + 10; break;
					case 3: amt = randint1(20) + 20; break;
					case 4: amt = randint1(30) + 30; break;
					case 5: amt = randint1(40) + 40; break;
					case 6: amt = 100; break;
					default: amt = 200; break;
				}

				/* Apply the stun */
				if (amt) {
					(void)player_inc_timed(p, TMD_STUN, amt,
						true, true, true);
				}
			}
		} else {
			/* Visible monster missed player, so notify if appropriate. */
			if (monster_is_visible(mon) &&	method->miss) {
				/* Disturbing */
				disturb(p);
				msg("%s misses you.", m_name);
			}
		}

		/* Analyze "visible" monsters only */
		if (visible) {
			/* Count "obvious" attacks (and ones that cause damage) */
			if (obvious || damage || (lore->blows[ap_cnt].times_seen > 10)) {
				/* Count attacks of this type */
				if (lore->blows[ap_cnt].times_seen < UCHAR_MAX)
					lore->blows[ap_cnt].times_seen++;
			}
		}

		/* Skip the other blows if the player has moved */
		if (!loc_eq(p->grid, pgrid)) break;
	}

	/* Blink away */
	if (blinked) {
		char dice[5];

		if (!p->is_dead && square_isseen(cave, mon->grid)) {
			add_monster_message(mon, MON_MSG_HIT_AND_RUN, true);
		}
		strnfmt(dice, sizeof(dice), "%d", z_info->max_sight * 2 + 5);
		effect_simple(EF_TELEPORT, source_monster(mon->midx), dice, 0, 0, 0, 0, 0, NULL);
	}

	/* Always notice cause of death */
	if (p->is_dead && (lore->deaths < SHRT_MAX))
		lore->deaths++;

	/* Learn lore */
	lore_update(mon->race, lore);

	/* Assume we attacked */
	return (true);
}